

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

_Bool parse_solver_param_val(TypedParam *out,char *val,ParamType type)

{
  _Bool local_31;
  char local_30 [7];
  _Bool parse_success;
  TypedParam local;
  ParamType type_local;
  char *val_local;
  TypedParam *out_local;
  
  local.field_2.sizeval._4_4_ = type;
  memset(local_30,0,0x10);
  val_local = (char *)out;
  if (out == (TypedParam *)0x0) {
    val_local = local_30;
  }
  local_31 = false;
  switch(local.field_2.sizeval._4_4_) {
  case 0:
    local_31 = str_to_double(val,(double *)(val_local + 8));
    break;
  case 1:
    local_31 = str_to_float(val,(float *)(val_local + 8));
    break;
  case 2:
    local_31 = str_to_bool(val,(_Bool *)(val_local + 8));
    break;
  case 3:
    local_31 = str_to_int32(val,(int32_t *)(val_local + 8));
    break;
  case 4:
    local_31 = str_to_usize(val,(size_t *)(val_local + 8));
    break;
  case 5:
    *(char **)(val_local + 8) = val;
    local_31 = true;
  }
  return local_31;
}

Assistant:

bool parse_solver_param_val(TypedParam *out, const char *val, ParamType type) {
    TypedParam local = {0};
    if (out == NULL) {
        out = &local;
    }

    bool parse_success = false;

    switch (type) {
    case TYPED_PARAM_STR:
        out->sval = val;
        parse_success = true;
        break;
    case TYPED_PARAM_BOOL:
        parse_success = str_to_bool(val, &out->bval);
        break;
    case TYPED_PARAM_INT32:
        parse_success = str_to_int32(val, &out->ival);
        break;
    case TYPED_PARAM_USIZE:
        parse_success = str_to_usize(val, &out->sizeval);
        break;
    case TYPED_PARAM_DOUBLE:
        parse_success = str_to_double(val, &out->dval);
        break;
    case TYPED_PARAM_FLOAT:
        parse_success = str_to_float(val, &out->fval);
        break;
    }

    return parse_success;
}